

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Client::Client(Client *this,Socket *sock,Server *server)

{
  impl_ *this_00;
  time_t tVar1;
  Server *server_local;
  Socket *sock_local;
  Client *this_local;
  
  this->_vptr_Client = (_func_int **)&PTR_NeedTick_002c5b98;
  this_00 = (impl_ *)operator_new(0x14);
  impl_::impl_(this_00,&sock->sock,&sock->sin);
  std::unique_ptr<Client::impl_,std::default_delete<Client::impl_>>::
  unique_ptr<std::default_delete<Client::impl_>,void>
            ((unique_ptr<Client::impl_,std::default_delete<Client::impl_>> *)&this->impl,this_00);
  this->server = server;
  this->connected = true;
  this->finished_writing = false;
  this->accepted = false;
  tVar1 = time((time_t *)0x0);
  this->connect_time = tVar1;
  std::__cxx11::string::string((string *)&this->recv_buffer);
  this->recv_buffer_gpos = 0;
  this->recv_buffer_ppos = 0;
  this->recv_buffer_used = 0;
  std::__cxx11::string::string((string *)&this->send_buffer);
  this->send_buffer_gpos = 0;
  this->send_buffer_ppos = 0;
  this->send_buffer_used = 0;
  return;
}

Assistant:

Client::Client(const Socket &sock, Server *server)
	: impl(new impl_(sock.sock, sock.sin))
	, server(server)
	, connected(true)
	, connect_time(std::time(0))
	, recv_buffer_gpos(0)
	, recv_buffer_ppos(0)
	, recv_buffer_used(0)
	, send_buffer_gpos(0)
	, send_buffer_ppos(0)
	, send_buffer_used(0)
{ }